

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O3

bool __thiscall
cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli)

{
  pointer pcVar1;
  Item *pIVar2;
  long *plVar3;
  bool bVar4;
  ItemVector *pIVar5;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  __it;
  long lVar6;
  long lVar7;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  _Var8;
  string config;
  long *local_118;
  long local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  undefined8 local_100;
  long *local_f8;
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_40;
  undefined8 local_38;
  
  pIVar5 = cmComputeLinkInformation::GetItems(cli);
  local_70 = local_60;
  pcVar1 = (cli->Config)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (cli->Config)._M_string_length);
  __it._M_current =
       (pIVar5->
       super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (pIVar5->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_70,local_68 + (long)local_70);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_d0,local_c8 + (long)local_d0);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_b0,local_a8 + (long)local_b0);
  local_118 = (long *)&local_108;
  std::__cxx11::string::_M_construct<char*>((string *)&local_118,local_90,local_88 + (long)local_90)
  ;
  lVar6 = local_110;
  local_40 = CONCAT71(uStack_107,local_108);
  local_50 = local_118;
  plVar3 = (long *)&local_108;
  if (local_118 == (long *)&local_108) {
    local_38 = local_100;
    local_50 = &local_40;
    plVar3 = local_118;
  }
  local_118 = plVar3;
  local_f8 = &local_40;
  local_108 = 0;
  local_110 = 0;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,local_50,(undefined1 *)(lVar6 + (long)local_50));
  lVar6 = (long)pIVar2 - (long)__it._M_current;
  lVar7 = (lVar6 >> 3) * -0x71c71c71c71c71c7 >> 2;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
              ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                            *)local_f0,__it);
      _Var8._M_current = __it._M_current;
      if (bVar4) goto LAB_0044282d;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
              ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                            *)local_f0,__it._M_current + 1);
      _Var8._M_current = __it._M_current + 1;
      if (bVar4) goto LAB_0044282d;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
              ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                            *)local_f0,__it._M_current + 2);
      _Var8._M_current = __it._M_current + 2;
      if (bVar4) goto LAB_0044282d;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
              ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                            *)local_f0,__it._M_current + 3);
      _Var8._M_current = __it._M_current + 3;
      if (bVar4) goto LAB_0044282d;
      __it._M_current = __it._M_current + 4;
      lVar7 = lVar7 + -1;
      lVar6 = lVar6 + -0x120;
    } while (1 < lVar7);
  }
  lVar6 = (lVar6 >> 3) * -0x71c71c71c71c71c7;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      _Var8._M_current = pIVar2;
      if ((lVar6 != 3) ||
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
                  ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                                *)local_f0,__it), _Var8._M_current = __it._M_current, bVar4))
      goto LAB_0044282d;
      __it._M_current = __it._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
            ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                          *)local_f0,__it);
    _Var8._M_current = __it._M_current;
    if (bVar4) goto LAB_0044282d;
    __it._M_current = __it._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::$_0>
          ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(cmComputeLinkInformation&)::__0>
                        *)local_f0,__it);
  _Var8._M_current = __it._M_current;
  if (!bVar4) {
    _Var8._M_current = pIVar2;
  }
LAB_0044282d:
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_50 != local_f8) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_118 != (long *)&local_108) {
    operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return _Var8._M_current != pIVar2;
}

Assistant:

bool cmLinkLineDeviceComputer::ComputeRequiresDeviceLinkingIPOFlag(
  cmComputeLinkInformation& cli)
{
  // Determine if this item might requires device linking.
  // For this we only consider targets
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  return std::any_of(
    items.begin(), items.end(),
    [config](cmComputeLinkInformation::Item const& item) -> bool {
      return item.Target &&
        item.Target->GetType() == cmStateEnums::STATIC_LIBRARY &&
        // this dependency requires us to device link it
        !item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS") &&
        item.Target->GetPropertyAsBool("CUDA_SEPARABLE_COMPILATION") &&
        item.Target->IsIPOEnabled("CUDA", config);
    });
}